

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteBlockDecl(BinaryWriter *this,BlockDeclaration *decl)

{
  pointer pTVar1;
  Stream *stream;
  uint32_t value;
  undefined8 in_RAX;
  char *desc;
  ulong uVar2;
  Enum value_00;
  Type local_18;
  Type local_14;
  
  if (((long)(decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start & 0x3fffffffcU) == 0) {
    pTVar1 = (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar2 = (long)(decl->sig).result_types.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pTVar1;
    if ((uVar2 & 0x3fffffff8) == 0) {
      stream = this->stream_;
      if ((uVar2 & 4) == 0) {
        _local_18 = CONCAT44((Enum)((ulong)in_RAX >> 0x20),0xffffffc0);
        desc = Type::GetName(&local_18);
        value_00 = Void;
      }
      else {
        value_00 = pTVar1->enum_;
        _local_18 = CONCAT44(value_00,(Enum)in_RAX);
        desc = Type::GetName(&local_14);
      }
      WriteS32Leb128(stream,value_00,desc);
      return;
    }
  }
  if (decl->has_func_type == true) {
    value = Module::GetFuncTypeIndex(this->module_,&decl->type_var);
  }
  else {
    value = Module::GetFuncTypeIndex(this->module_,&decl->sig);
  }
  if (value != 0xffffffff) {
    WriteS32Leb128(this->stream_,value,"block type function index");
    return;
  }
  __assert_fail("index != kInvalidIndex",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binary-writer.cc"
                ,0xf6,
                "void wabt::(anonymous namespace)::BinaryWriter::WriteBlockDecl(const BlockDeclaration &)"
               );
}

Assistant:

void BinaryWriter::WriteBlockDecl(const BlockDeclaration& decl) {
  if (decl.sig.GetNumParams() == 0 && decl.sig.GetNumResults() <= 1) {
    if (decl.sig.GetNumResults() == 0) {
      WriteType(stream_, Type::Void);
    } else if (decl.sig.GetNumResults() == 1) {
      WriteType(stream_, decl.sig.GetResultType(0));
    }
    return;
  }

  Index index = decl.has_func_type ? module_->GetFuncTypeIndex(decl.type_var)
                                   : module_->GetFuncTypeIndex(decl.sig);
  assert(index != kInvalidIndex);
  WriteS32Leb128(stream_, index, "block type function index");
}